

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_WriteIteratedLogicalExpr_Test::~ExprWriterTest_WriteIteratedLogicalExpr_Test
          (ExprWriterTest_WriteIteratedLogicalExpr_Test *this)

{
  ExprWriterTest::~ExprWriterTest(&this->super_ExprWriterTest);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteIteratedLogicalExpr) {
  LogicalExpr args[] = {
    MakeRelational(ex::EQ, MakeVariable(0), MakeConst(0)), l1, l0
  };
  CHECK_WRITE("if /* forall */ (x1 = 0 && 1 && 0) then 1",
      MakeIf(MakeIteratedLogical(ex::FORALL, args),
             MakeConst(1), MakeConst(0)));
  CHECK_WRITE("if /* exists */ (x1 = 0 || 1 || 0) then 1",
      MakeIf(MakeIteratedLogical(ex::EXISTS, args),
             MakeConst(1), MakeConst(0)));
}